

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# util.cpp
# Opt level: O1

void __thiscall
Sections::Push(Sections *this,RPCArg *arg,size_t current_indent,OuterType outer_type)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  Type TVar2;
  pointer pbVar3;
  pointer pRVar4;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *pbVar5;
  size_type sVar6;
  undefined8 uVar7;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar8;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar9;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar10;
  char *pcVar11;
  _Alloc_hider _Var12;
  RPCArg *arg_inner;
  pointer pRVar13;
  size_type sVar14;
  long in_FS_OFFSET;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> __str_2;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> __str_1;
  string right_1;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> __str;
  string left;
  string indent_next;
  string indent;
  string local_198;
  string local_178;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_158;
  Section local_138;
  string local_f8;
  string local_d8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_b8;
  string local_98;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_78;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_58;
  long local_38;
  
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  local_58._M_dataplus._M_p = (pointer)&local_58.field_2;
  std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::_M_construct
            (&local_58,current_indent,' ');
  sVar14 = current_indent + 2;
  local_78._M_dataplus._M_p = (pointer)&local_78.field_2;
  std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::_M_construct
            (&local_78,sVar14,' ');
  TVar2 = arg->m_type;
  if (TVar2 < (STR_HEX|STR)) {
    if ((0x3bcU >> (TVar2 & 0x1f) & 1) == 0) {
      if ((0x41U >> (TVar2 & 0x1f) & 1) == 0) {
        local_98._M_dataplus._M_p = (pointer)&local_98.field_2;
        std::__cxx11::string::_M_construct<char*>
                  ((string *)&local_98,local_58._M_dataplus._M_p,
                   local_58._M_dataplus._M_p + local_58._M_string_length);
        if (outer_type == OBJ) {
          ::RPCArg::GetName_abi_cxx11_(&local_d8,arg);
          pbVar5 = std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::
                   replace(&local_d8,0,0,"\"",1);
          local_b8._M_dataplus._M_p = (pointer)&local_b8.field_2;
          paVar8 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                    *)(pbVar5->_M_dataplus)._M_p;
          paVar9 = &pbVar5->field_2;
          if (paVar8 == paVar9) {
            local_b8.field_2._M_allocated_capacity = paVar9->_M_allocated_capacity;
            local_b8.field_2._8_8_ = *(undefined8 *)((long)&pbVar5->field_2 + 8);
          }
          else {
            local_b8.field_2._M_allocated_capacity = paVar9->_M_allocated_capacity;
            local_b8._M_dataplus._M_p = (pointer)paVar8;
          }
          local_b8._M_string_length = pbVar5->_M_string_length;
          (pbVar5->_M_dataplus)._M_p = (pointer)paVar9;
          pbVar5->_M_string_length = 0;
          (pbVar5->field_2)._M_local_buf[0] = '\0';
          pbVar5 = std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::
                   append(&local_b8,"\": ");
          local_138.m_left._M_dataplus._M_p = (pointer)&local_138.m_left.field_2;
          paVar8 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                    *)(pbVar5->_M_dataplus)._M_p;
          paVar9 = &pbVar5->field_2;
          if (paVar8 == paVar9) {
            local_138.m_left.field_2._M_allocated_capacity = paVar9->_M_allocated_capacity;
            local_138.m_left.field_2._8_8_ = *(undefined8 *)((long)&pbVar5->field_2 + 8);
          }
          else {
            local_138.m_left.field_2._M_allocated_capacity = paVar9->_M_allocated_capacity;
            local_138.m_left._M_dataplus._M_p = (pointer)paVar8;
          }
          local_138.m_left._M_string_length = pbVar5->_M_string_length;
          (pbVar5->_M_dataplus)._M_p = (pointer)paVar9;
          pbVar5->_M_string_length = 0;
          (pbVar5->field_2)._M_local_buf[0] = '\0';
        }
        else {
          local_138.m_left._M_dataplus._M_p = (pointer)&local_138.m_left.field_2;
          std::__cxx11::string::_M_construct<char_const*>((string *)&local_138,"");
        }
        std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::_M_append
                  (&local_98,local_138.m_left._M_dataplus._M_p,local_138.m_left._M_string_length);
        paVar8 = &local_138.m_left.field_2;
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_138.m_left._M_dataplus._M_p != paVar8) {
          operator_delete(local_138.m_left._M_dataplus._M_p,
                          local_138.m_left.field_2._M_allocated_capacity + 1);
        }
        if (outer_type == OBJ) {
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_b8._M_dataplus._M_p != &local_b8.field_2) {
            operator_delete(local_b8._M_dataplus._M_p,local_b8.field_2._M_allocated_capacity + 1);
          }
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_d8._M_dataplus._M_p != &local_d8.field_2) {
            operator_delete(local_d8._M_dataplus._M_p,local_d8.field_2._M_allocated_capacity + 1);
          }
        }
        std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::append
                  (&local_98,"[");
        if (outer_type == NONE) {
          local_f8._M_dataplus._M_p = (pointer)&local_f8.field_2;
          std::__cxx11::string::_M_construct<char_const*>((string *)&local_f8,"");
        }
        else {
          ::RPCArg::ToDescriptionString_abi_cxx11_(&local_f8,arg,outer_type == OBJ);
        }
        Section::Section(&local_138,&local_98,&local_f8);
        sVar6 = local_138.m_left._M_string_length;
        if (local_138.m_left._M_string_length < this->m_max_pad) {
          sVar6 = this->m_max_pad;
        }
        this->m_max_pad = sVar6;
        std::vector<Section,_std::allocator<Section>_>::push_back(&this->m_sections,&local_138);
        paVar9 = &local_138.m_right.field_2;
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_138.m_right._M_dataplus._M_p != paVar9) {
          operator_delete(local_138.m_right._M_dataplus._M_p,
                          local_138.m_right.field_2._M_allocated_capacity + 1);
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_138.m_left._M_dataplus._M_p != paVar8) {
          operator_delete(local_138.m_left._M_dataplus._M_p,
                          local_138.m_left.field_2._M_allocated_capacity + 1);
        }
        pRVar4 = (arg->m_inner).super__Vector_base<RPCArg,_std::allocator<RPCArg>_>._M_impl.
                 super__Vector_impl_data._M_finish;
        for (pRVar13 = (arg->m_inner).super__Vector_base<RPCArg,_std::allocator<RPCArg>_>._M_impl.
                       super__Vector_impl_data._M_start; pRVar13 != pRVar4; pRVar13 = pRVar13 + 1) {
          Push(this,pRVar13,sVar14,ARR);
        }
        paVar8 = &local_158.field_2;
        local_158._M_dataplus._M_p = (pointer)paVar8;
        std::__cxx11::string::_M_construct<char*>
                  ((string *)&local_158,local_78._M_dataplus._M_p,
                   local_78._M_dataplus._M_p + local_78._M_string_length);
        std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::append
                  (&local_158,"...");
        paVar1 = &local_178.field_2;
        local_178._M_dataplus._M_p = (pointer)paVar1;
        std::__cxx11::string::_M_construct<char_const*>((string *)&local_178,"","");
        Section::Section(&local_138,&local_158,&local_178);
        sVar14 = local_138.m_left._M_string_length;
        if (local_138.m_left._M_string_length < this->m_max_pad) {
          sVar14 = this->m_max_pad;
        }
        this->m_max_pad = sVar14;
        std::vector<Section,_std::allocator<Section>_>::push_back(&this->m_sections,&local_138);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_138.m_right._M_dataplus._M_p != paVar9) {
          operator_delete(local_138.m_right._M_dataplus._M_p,
                          local_138.m_right.field_2._M_allocated_capacity + 1);
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_138.m_left._M_dataplus._M_p != &local_138.m_left.field_2) {
          operator_delete(local_138.m_left._M_dataplus._M_p,
                          local_138.m_left.field_2._M_allocated_capacity + 1);
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_178._M_dataplus._M_p != paVar1) {
          operator_delete(local_178._M_dataplus._M_p,local_178.field_2._M_allocated_capacity + 1);
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_158._M_dataplus._M_p != paVar8) {
          operator_delete(local_158._M_dataplus._M_p,local_158.field_2._M_allocated_capacity + 1);
        }
        local_178._M_dataplus._M_p = (pointer)paVar1;
        std::__cxx11::string::_M_construct<char*>
                  ((string *)&local_178,local_58._M_dataplus._M_p,
                   local_58._M_dataplus._M_p + local_58._M_string_length);
        std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::append
                  (&local_178,"]");
        pcVar11 = ",";
        if (outer_type == NONE) {
          pcVar11 = "";
        }
        pbVar5 = std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::
                 append(&local_178,pcVar11);
        local_158._M_dataplus._M_p = (pbVar5->_M_dataplus)._M_p;
        paVar10 = &pbVar5->field_2;
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_158._M_dataplus._M_p == paVar10) {
          local_158.field_2._M_allocated_capacity = paVar10->_M_allocated_capacity;
          local_158.field_2._8_8_ = *(undefined8 *)((long)&pbVar5->field_2 + 8);
          local_158._M_dataplus._M_p = (pointer)paVar8;
        }
        else {
          local_158.field_2._M_allocated_capacity = paVar10->_M_allocated_capacity;
        }
        local_158._M_string_length = pbVar5->_M_string_length;
        (pbVar5->_M_dataplus)._M_p = (pointer)paVar10;
        pbVar5->_M_string_length = 0;
        (pbVar5->field_2)._M_local_buf[0] = '\0';
        local_198._M_dataplus._M_p = (pointer)&local_198.field_2;
        std::__cxx11::string::_M_construct<char_const*>((string *)&local_198,"");
        Section::Section(&local_138,&local_158,&local_198);
        sVar14 = local_138.m_left._M_string_length;
        if (local_138.m_left._M_string_length < this->m_max_pad) {
          sVar14 = this->m_max_pad;
        }
        this->m_max_pad = sVar14;
        std::vector<Section,_std::allocator<Section>_>::push_back(&this->m_sections,&local_138);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_138.m_right._M_dataplus._M_p != paVar9) {
          operator_delete(local_138.m_right._M_dataplus._M_p,
                          local_138.m_right.field_2._M_allocated_capacity + 1);
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_138.m_left._M_dataplus._M_p != &local_138.m_left.field_2) {
          operator_delete(local_138.m_left._M_dataplus._M_p,
                          local_138.m_left.field_2._M_allocated_capacity + 1);
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_198._M_dataplus._M_p != &local_198.field_2) {
          operator_delete(local_198._M_dataplus._M_p,local_198.field_2._M_allocated_capacity + 1);
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_158._M_dataplus._M_p != paVar8) {
          operator_delete(local_158._M_dataplus._M_p,local_158.field_2._M_allocated_capacity + 1);
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_178._M_dataplus._M_p != paVar1) {
          operator_delete(local_178._M_dataplus._M_p,local_178.field_2._M_allocated_capacity + 1);
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_f8._M_dataplus._M_p != &local_f8.field_2) {
          operator_delete(local_f8._M_dataplus._M_p,local_f8.field_2._M_allocated_capacity + 1);
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_98._M_dataplus._M_p != &local_98.field_2) goto LAB_00700c84;
      }
      else {
        if (outer_type == NONE) {
          local_98._M_dataplus._M_p = (pointer)&local_98.field_2;
          std::__cxx11::string::_M_construct<char_const*>((string *)&local_98,"");
        }
        else {
          ::RPCArg::ToDescriptionString_abi_cxx11_(&local_98,arg,outer_type == OBJ);
        }
        if (outer_type == OBJ) {
          ::RPCArg::GetName_abi_cxx11_(&local_178,arg);
          pbVar5 = std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::
                   replace(&local_178,0,0,"\"",1);
          local_158._M_dataplus._M_p = (pointer)&local_158.field_2;
          paVar8 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                    *)(pbVar5->_M_dataplus)._M_p;
          paVar9 = &pbVar5->field_2;
          if (paVar8 == paVar9) {
            local_158.field_2._M_allocated_capacity = paVar9->_M_allocated_capacity;
            local_158.field_2._8_8_ = *(undefined8 *)((long)&pbVar5->field_2 + 8);
          }
          else {
            local_158.field_2._M_allocated_capacity = paVar9->_M_allocated_capacity;
            local_158._M_dataplus._M_p = (pointer)paVar8;
          }
          local_158._M_string_length = pbVar5->_M_string_length;
          (pbVar5->_M_dataplus)._M_p = (pointer)paVar9;
          pbVar5->_M_string_length = 0;
          (pbVar5->field_2)._M_local_buf[0] = '\0';
          pbVar5 = std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::
                   append(&local_158,"\": ");
          local_f8._M_dataplus._M_p = (pointer)&local_f8.field_2;
          paVar8 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                    *)(pbVar5->_M_dataplus)._M_p;
          paVar9 = &pbVar5->field_2;
          if (paVar8 == paVar9) {
            local_f8.field_2._M_allocated_capacity = paVar9->_M_allocated_capacity;
            local_f8.field_2._8_8_ = *(undefined8 *)((long)&pbVar5->field_2 + 8);
          }
          else {
            local_f8.field_2._M_allocated_capacity = paVar9->_M_allocated_capacity;
            local_f8._M_dataplus._M_p = (pointer)paVar8;
          }
          local_f8._M_string_length = pbVar5->_M_string_length;
          (pbVar5->_M_dataplus)._M_p = (pointer)paVar9;
          pbVar5->_M_string_length = 0;
          (pbVar5->field_2)._M_local_buf[0] = '\0';
        }
        else {
          local_f8._M_dataplus._M_p = (pointer)&local_f8.field_2;
          std::__cxx11::string::_M_construct<char_const*>((string *)&local_f8);
        }
        pbVar5 = std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::
                 replace(&local_f8,0,0,local_58._M_dataplus._M_p,local_58._M_string_length);
        local_d8._M_dataplus._M_p = (pointer)&local_d8.field_2;
        paVar8 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                  *)(pbVar5->_M_dataplus)._M_p;
        paVar9 = &pbVar5->field_2;
        if (paVar8 == paVar9) {
          local_d8.field_2._M_allocated_capacity = paVar9->_M_allocated_capacity;
          local_d8.field_2._8_8_ = *(undefined8 *)((long)&pbVar5->field_2 + 8);
        }
        else {
          local_d8.field_2._M_allocated_capacity = paVar9->_M_allocated_capacity;
          local_d8._M_dataplus._M_p = (pointer)paVar8;
        }
        local_d8._M_string_length = pbVar5->_M_string_length;
        (pbVar5->_M_dataplus)._M_p = (pointer)paVar9;
        pbVar5->_M_string_length = 0;
        (pbVar5->field_2)._M_local_buf[0] = '\0';
        pbVar5 = std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::
                 append(&local_d8,"{");
        local_b8._M_dataplus._M_p = (pointer)&local_b8.field_2;
        paVar8 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                  *)(pbVar5->_M_dataplus)._M_p;
        paVar9 = &pbVar5->field_2;
        if (paVar8 == paVar9) {
          local_b8.field_2._M_allocated_capacity = paVar9->_M_allocated_capacity;
          local_b8.field_2._8_8_ = *(undefined8 *)((long)&pbVar5->field_2 + 8);
        }
        else {
          local_b8.field_2._M_allocated_capacity = paVar9->_M_allocated_capacity;
          local_b8._M_dataplus._M_p = (pointer)paVar8;
        }
        local_b8._M_string_length = pbVar5->_M_string_length;
        (pbVar5->_M_dataplus)._M_p = (pointer)paVar9;
        pbVar5->_M_string_length = 0;
        (pbVar5->field_2)._M_local_buf[0] = '\0';
        Section::Section(&local_138,&local_b8,&local_98);
        sVar6 = local_138.m_left._M_string_length;
        if (local_138.m_left._M_string_length < this->m_max_pad) {
          sVar6 = this->m_max_pad;
        }
        this->m_max_pad = sVar6;
        std::vector<Section,_std::allocator<Section>_>::push_back(&this->m_sections,&local_138);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_138.m_right._M_dataplus._M_p != &local_138.m_right.field_2) {
          operator_delete(local_138.m_right._M_dataplus._M_p,
                          local_138.m_right.field_2._M_allocated_capacity + 1);
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_138.m_left._M_dataplus._M_p != &local_138.m_left.field_2) {
          operator_delete(local_138.m_left._M_dataplus._M_p,
                          local_138.m_left.field_2._M_allocated_capacity + 1);
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_b8._M_dataplus._M_p != &local_b8.field_2) {
          operator_delete(local_b8._M_dataplus._M_p,local_b8.field_2._M_allocated_capacity + 1);
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_d8._M_dataplus._M_p != &local_d8.field_2) {
          operator_delete(local_d8._M_dataplus._M_p,local_d8.field_2._M_allocated_capacity + 1);
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_f8._M_dataplus._M_p != &local_f8.field_2) {
          operator_delete(local_f8._M_dataplus._M_p,local_f8.field_2._M_allocated_capacity + 1);
        }
        if (outer_type == OBJ) {
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_158._M_dataplus._M_p != &local_158.field_2) {
            operator_delete(local_158._M_dataplus._M_p,local_158.field_2._M_allocated_capacity + 1);
          }
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_178._M_dataplus._M_p != &local_178.field_2) {
            operator_delete(local_178._M_dataplus._M_p,local_178.field_2._M_allocated_capacity + 1);
          }
        }
        pRVar4 = (arg->m_inner).super__Vector_base<RPCArg,_std::allocator<RPCArg>_>._M_impl.
                 super__Vector_impl_data._M_finish;
        for (pRVar13 = (arg->m_inner).super__Vector_base<RPCArg,_std::allocator<RPCArg>_>._M_impl.
                       super__Vector_impl_data._M_start; pRVar13 != pRVar4; pRVar13 = pRVar13 + 1) {
          Push(this,pRVar13,sVar14,OBJ);
        }
        paVar8 = &local_d8.field_2;
        if (arg->m_type != OBJ) {
          local_b8._M_dataplus._M_p = (pointer)&local_b8.field_2;
          std::__cxx11::string::_M_construct<char*>
                    ((string *)&local_b8,local_78._M_dataplus._M_p,
                     local_78._M_dataplus._M_p + local_78._M_string_length);
          std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::append
                    (&local_b8,"...");
          local_d8._M_dataplus._M_p = (pointer)paVar8;
          std::__cxx11::string::_M_construct<char_const*>((string *)&local_d8,"");
          Section::Section(&local_138,&local_b8,&local_d8);
          sVar14 = local_138.m_left._M_string_length;
          if (local_138.m_left._M_string_length < this->m_max_pad) {
            sVar14 = this->m_max_pad;
          }
          this->m_max_pad = sVar14;
          std::vector<Section,_std::allocator<Section>_>::push_back(&this->m_sections,&local_138);
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_138.m_right._M_dataplus._M_p != &local_138.m_right.field_2) {
            operator_delete(local_138.m_right._M_dataplus._M_p,
                            local_138.m_right.field_2._M_allocated_capacity + 1);
          }
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_138.m_left._M_dataplus._M_p != &local_138.m_left.field_2) {
            operator_delete(local_138.m_left._M_dataplus._M_p,
                            local_138.m_left.field_2._M_allocated_capacity + 1);
          }
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_d8._M_dataplus._M_p != paVar8) {
            operator_delete(local_d8._M_dataplus._M_p,local_d8.field_2._M_allocated_capacity + 1);
          }
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_b8._M_dataplus._M_p != &local_b8.field_2) {
            operator_delete(local_b8._M_dataplus._M_p,local_b8.field_2._M_allocated_capacity + 1);
          }
        }
        local_d8._M_dataplus._M_p = (pointer)paVar8;
        std::__cxx11::string::_M_construct<char*>
                  ((string *)&local_d8,local_58._M_dataplus._M_p,
                   local_58._M_dataplus._M_p + local_58._M_string_length);
        std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::append
                  (&local_d8,"}");
        pcVar11 = ",";
        if (outer_type == NONE) {
          pcVar11 = "";
        }
        pbVar5 = std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::
                 append(&local_d8,pcVar11);
        local_b8._M_dataplus._M_p = (pbVar5->_M_dataplus)._M_p;
        paVar9 = &pbVar5->field_2;
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_b8._M_dataplus._M_p == paVar9) {
          local_b8.field_2._M_allocated_capacity = paVar9->_M_allocated_capacity;
          local_b8.field_2._8_8_ = *(undefined8 *)((long)&pbVar5->field_2 + 8);
          local_b8._M_dataplus._M_p = (pointer)&local_b8.field_2;
        }
        else {
          local_b8.field_2._M_allocated_capacity = paVar9->_M_allocated_capacity;
        }
        local_b8._M_string_length = pbVar5->_M_string_length;
        (pbVar5->_M_dataplus)._M_p = (pointer)paVar9;
        pbVar5->_M_string_length = 0;
        (pbVar5->field_2)._M_local_buf[0] = '\0';
        local_f8._M_dataplus._M_p = (pointer)&local_f8.field_2;
        std::__cxx11::string::_M_construct<char_const*>((string *)&local_f8,"");
        Section::Section(&local_138,&local_b8,&local_f8);
        sVar14 = local_138.m_left._M_string_length;
        if (local_138.m_left._M_string_length < this->m_max_pad) {
          sVar14 = this->m_max_pad;
        }
        this->m_max_pad = sVar14;
        std::vector<Section,_std::allocator<Section>_>::push_back(&this->m_sections,&local_138);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_138.m_right._M_dataplus._M_p != &local_138.m_right.field_2) {
          operator_delete(local_138.m_right._M_dataplus._M_p,
                          local_138.m_right.field_2._M_allocated_capacity + 1);
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_138.m_left._M_dataplus._M_p != &local_138.m_left.field_2) {
          operator_delete(local_138.m_left._M_dataplus._M_p,
                          local_138.m_left.field_2._M_allocated_capacity + 1);
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_f8._M_dataplus._M_p != &local_f8.field_2) {
          operator_delete(local_f8._M_dataplus._M_p,local_f8.field_2._M_allocated_capacity + 1);
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_b8._M_dataplus._M_p != &local_b8.field_2) {
          operator_delete(local_b8._M_dataplus._M_p,local_b8.field_2._M_allocated_capacity + 1);
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_d8._M_dataplus._M_p != paVar8) {
          operator_delete(local_d8._M_dataplus._M_p,local_d8.field_2._M_allocated_capacity + 1);
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_98._M_dataplus._M_p != &local_98.field_2) {
LAB_00700c84:
          operator_delete(local_98._M_dataplus._M_p,local_98.field_2._M_allocated_capacity + 1);
        }
      }
    }
    else if (outer_type != NONE) {
      local_98._M_dataplus._M_p = (pointer)&local_98.field_2;
      std::__cxx11::string::_M_construct<char*>
                ((string *)&local_98,local_58._M_dataplus._M_p,
                 local_58._M_dataplus._M_p + local_58._M_string_length);
      if ((outer_type == OBJ) &&
         ((arg->m_opts).type_str.
          super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ._M_impl.super__Vector_impl_data._M_finish !=
          (arg->m_opts).type_str.
          super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ._M_impl.super__Vector_impl_data._M_start)) {
        ::RPCArg::GetName_abi_cxx11_(&local_f8,arg);
        pbVar5 = std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::
                 replace(&local_f8,0,0,"\"",1);
        local_d8._M_dataplus._M_p = (pbVar5->_M_dataplus)._M_p;
        paVar8 = &pbVar5->field_2;
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_d8._M_dataplus._M_p == paVar8) {
          local_d8.field_2._M_allocated_capacity = paVar8->_M_allocated_capacity;
          local_d8.field_2._8_8_ = *(undefined8 *)((long)&pbVar5->field_2 + 8);
          local_d8._M_dataplus._M_p = (pointer)&local_d8.field_2;
        }
        else {
          local_d8.field_2._M_allocated_capacity = paVar8->_M_allocated_capacity;
        }
        local_d8._M_string_length = pbVar5->_M_string_length;
        (pbVar5->_M_dataplus)._M_p = (pointer)paVar8;
        pbVar5->_M_string_length = 0;
        (pbVar5->field_2)._M_local_buf[0] = '\0';
        pbVar5 = std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::
                 append(&local_d8,"\": ");
        local_b8._M_dataplus._M_p = (pbVar5->_M_dataplus)._M_p;
        paVar8 = &pbVar5->field_2;
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_b8._M_dataplus._M_p == paVar8) {
          local_b8.field_2._M_allocated_capacity = paVar8->_M_allocated_capacity;
          local_b8.field_2._8_8_ = *(undefined8 *)((long)&pbVar5->field_2 + 8);
          local_b8._M_dataplus._M_p = (pointer)&local_b8.field_2;
        }
        else {
          local_b8.field_2._M_allocated_capacity = paVar8->_M_allocated_capacity;
        }
        local_b8._M_string_length = pbVar5->_M_string_length;
        (pbVar5->_M_dataplus)._M_p = (pointer)paVar8;
        pbVar5->_M_string_length = 0;
        (pbVar5->field_2)._M_local_buf[0] = '\0';
        pbVar3 = (arg->m_opts).type_str.
                 super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 ._M_impl.super__Vector_impl_data._M_start;
        if ((arg->m_opts).type_str.
            super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            ._M_impl.super__Vector_impl_data._M_finish == pbVar3) {
          if (*(long *)(in_FS_OFFSET + 0x28) == local_38) {
            uVar7 = std::__throw_out_of_range_fmt
                              ("vector::_M_range_check: __n (which is %zu) >= this->size() (which is %zu)"
                               ,0,0);
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_b8._M_dataplus._M_p != &local_b8.field_2) {
              operator_delete(local_b8._M_dataplus._M_p,local_b8.field_2._M_allocated_capacity + 1);
            }
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_d8._M_dataplus._M_p != &local_d8.field_2) {
              operator_delete(local_d8._M_dataplus._M_p,local_d8.field_2._M_allocated_capacity + 1);
            }
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_98._M_dataplus._M_p != &local_98.field_2) {
              operator_delete(local_98._M_dataplus._M_p,local_98.field_2._M_allocated_capacity + 1);
            }
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_78._M_dataplus._M_p != &local_78.field_2) {
              operator_delete(local_78._M_dataplus._M_p,local_78.field_2._M_allocated_capacity + 1);
            }
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_58._M_dataplus._M_p != &local_58.field_2) {
              operator_delete(local_58._M_dataplus._M_p,local_58.field_2._M_allocated_capacity + 1);
            }
            if (*(long *)(in_FS_OFFSET + 0x28) == local_38) {
              _Unwind_Resume(uVar7);
            }
          }
          goto LAB_00701d14;
        }
        pbVar5 = std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::
                 _M_append(&local_b8,(pbVar3->_M_dataplus)._M_p,pbVar3->_M_string_length);
        paVar8 = &local_138.m_left.field_2;
        local_138.m_left._M_dataplus._M_p = (pbVar5->_M_dataplus)._M_p;
        paVar9 = &pbVar5->field_2;
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_138.m_left._M_dataplus._M_p == paVar9) {
          local_138.m_left.field_2._M_allocated_capacity = paVar9->_M_allocated_capacity;
          local_138.m_left.field_2._8_8_ = *(undefined8 *)((long)&pbVar5->field_2 + 8);
          local_138.m_left._M_dataplus._M_p = (pointer)paVar8;
        }
        else {
          local_138.m_left.field_2._M_allocated_capacity = paVar9->_M_allocated_capacity;
        }
        local_138.m_left._M_string_length = pbVar5->_M_string_length;
        (pbVar5->_M_dataplus)._M_p = (pointer)paVar9;
        pbVar5->_M_string_length = 0;
        (pbVar5->field_2)._M_local_buf[0] = '\0';
        std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::_M_append
                  (&local_98,local_138.m_left._M_dataplus._M_p,local_138.m_left._M_string_length);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_138.m_left._M_dataplus._M_p != paVar8) {
          operator_delete(local_138.m_left._M_dataplus._M_p,
                          local_138.m_left.field_2._M_allocated_capacity + 1);
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_b8._M_dataplus._M_p != &local_b8.field_2) {
          operator_delete(local_b8._M_dataplus._M_p,local_b8.field_2._M_allocated_capacity + 1);
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_d8._M_dataplus._M_p != &local_d8.field_2) {
          operator_delete(local_d8._M_dataplus._M_p,local_d8.field_2._M_allocated_capacity + 1);
        }
        uVar7 = local_f8.field_2._M_allocated_capacity;
        _Var12._M_p = local_f8._M_dataplus._M_p;
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_f8._M_dataplus._M_p != &local_f8.field_2) goto LAB_00700bac;
      }
      else {
        if (outer_type == OBJ) {
          ::RPCArg::ToStringObj_abi_cxx11_(&local_138.m_left,arg,false);
        }
        else {
          ::RPCArg::ToString_abi_cxx11_(&local_138.m_left,arg,false);
        }
        std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::_M_append
                  (&local_98,local_138.m_left._M_dataplus._M_p,local_138.m_left._M_string_length);
        uVar7 = local_138.m_left.field_2._M_allocated_capacity;
        _Var12._M_p = local_138.m_left._M_dataplus._M_p;
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_138.m_left._M_dataplus._M_p != &local_138.m_left.field_2) {
LAB_00700bac:
          operator_delete(_Var12._M_p,uVar7 + 1);
        }
      }
      std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::append
                (&local_98,",");
      ::RPCArg::ToDescriptionString_abi_cxx11_(&local_b8,arg,outer_type == OBJ);
      Section::Section(&local_138,&local_98,&local_b8);
      sVar14 = local_138.m_left._M_string_length;
      if (local_138.m_left._M_string_length < this->m_max_pad) {
        sVar14 = this->m_max_pad;
      }
      this->m_max_pad = sVar14;
      std::vector<Section,_std::allocator<Section>_>::push_back(&this->m_sections,&local_138);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_138.m_right._M_dataplus._M_p != &local_138.m_right.field_2) {
        operator_delete(local_138.m_right._M_dataplus._M_p,
                        local_138.m_right.field_2._M_allocated_capacity + 1);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_138.m_left._M_dataplus._M_p != &local_138.m_left.field_2) {
        operator_delete(local_138.m_left._M_dataplus._M_p,
                        local_138.m_left.field_2._M_allocated_capacity + 1);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_b8._M_dataplus._M_p != &local_b8.field_2) {
        operator_delete(local_b8._M_dataplus._M_p,local_b8.field_2._M_allocated_capacity + 1);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_98._M_dataplus._M_p != &local_98.field_2) goto LAB_00700c84;
    }
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_78._M_dataplus._M_p != &local_78.field_2) {
    operator_delete(local_78._M_dataplus._M_p,local_78.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_58._M_dataplus._M_p != &local_58.field_2) {
    operator_delete(local_58._M_dataplus._M_p,local_58.field_2._M_allocated_capacity + 1);
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == local_38) {
    return;
  }
LAB_00701d14:
  __stack_chk_fail();
}

Assistant:

void Push(const RPCArg& arg, const size_t current_indent = 5, const OuterType outer_type = OuterType::NONE)
    {
        const auto indent = std::string(current_indent, ' ');
        const auto indent_next = std::string(current_indent + 2, ' ');
        const bool push_name{outer_type == OuterType::OBJ}; // Dictionary keys must have a name
        const bool is_top_level_arg{outer_type == OuterType::NONE}; // True on the first recursion

        switch (arg.m_type) {
        case RPCArg::Type::STR_HEX:
        case RPCArg::Type::STR:
        case RPCArg::Type::NUM:
        case RPCArg::Type::AMOUNT:
        case RPCArg::Type::RANGE:
        case RPCArg::Type::BOOL:
        case RPCArg::Type::OBJ_NAMED_PARAMS: {
            if (is_top_level_arg) return; // Nothing more to do for non-recursive types on first recursion
            auto left = indent;
            if (arg.m_opts.type_str.size() != 0 && push_name) {
                left += "\"" + arg.GetName() + "\": " + arg.m_opts.type_str.at(0);
            } else {
                left += push_name ? arg.ToStringObj(/*oneline=*/false) : arg.ToString(/*oneline=*/false);
            }
            left += ",";
            PushSection({left, arg.ToDescriptionString(/*is_named_arg=*/push_name)});
            break;
        }
        case RPCArg::Type::OBJ:
        case RPCArg::Type::OBJ_USER_KEYS: {
            const auto right = is_top_level_arg ? "" : arg.ToDescriptionString(/*is_named_arg=*/push_name);
            PushSection({indent + (push_name ? "\"" + arg.GetName() + "\": " : "") + "{", right});
            for (const auto& arg_inner : arg.m_inner) {
                Push(arg_inner, current_indent + 2, OuterType::OBJ);
            }
            if (arg.m_type != RPCArg::Type::OBJ) {
                PushSection({indent_next + "...", ""});
            }
            PushSection({indent + "}" + (is_top_level_arg ? "" : ","), ""});
            break;
        }
        case RPCArg::Type::ARR: {
            auto left = indent;
            left += push_name ? "\"" + arg.GetName() + "\": " : "";
            left += "[";
            const auto right = is_top_level_arg ? "" : arg.ToDescriptionString(/*is_named_arg=*/push_name);
            PushSection({left, right});
            for (const auto& arg_inner : arg.m_inner) {
                Push(arg_inner, current_indent + 2, OuterType::ARR);
            }
            PushSection({indent_next + "...", ""});
            PushSection({indent + "]" + (is_top_level_arg ? "" : ","), ""});
            break;
        }
        } // no default case, so the compiler can warn about missing cases
    }